

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_generate.cc
# Opt level: O0

void __thiscall Trie::build_max(Trie *this,string *prefix)

{
  string *psVar1;
  reference ppTVar2;
  Trie *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  char c;
  size_t id;
  string local_40 [39];
  char local_19;
  string *psVar3;
  string *prefix_00;
  Trie *this_00;
  
  (in_RDI->field_2)._M_allocated_capacity = *(size_type *)in_RDI;
  this_00 = in_RSI;
  std::__cxx11::string::operator=((string *)((in_RDI->field_2)._M_local_buf + 8),(string *)in_RSI);
  psVar3 = (string *)0x0;
  while (prefix_00 = psVar3,
        psVar1 = (string *)
                 std::vector<Trie_*,_std::allocator<Trie_*>_>::size
                           ((vector<Trie_*,_std::allocator<Trie_*>_> *)
                            ((long)&in_RDI[1].field_2 + 8)), psVar3 < psVar1) {
    ppTVar2 = std::vector<Trie_*,_std::allocator<Trie_*>_>::operator[]
                        ((vector<Trie_*,_std::allocator<Trie_*>_> *)((long)&in_RDI[1].field_2 + 8),
                         (size_type)prefix_00);
    if (*ppTVar2 != (value_type)0x0) {
      local_19 = action2char((int)prefix_00 + 1);
      std::vector<Trie_*,_std::allocator<Trie_*>_>::operator[]
                ((vector<Trie_*,_std::allocator<Trie_*>_> *)((long)&in_RDI[1].field_2 + 8),
                 (size_type)prefix_00);
      std::operator+(in_RDI,(char)((ulong)in_RSI >> 0x38));
      build_max(this_00,prefix_00);
      std::__cxx11::string::~string(local_40);
      ppTVar2 = std::vector<Trie_*,_std::allocator<Trie_*>_>::operator[]
                          ((vector<Trie_*,_std::allocator<Trie_*>_> *)((long)&in_RDI[1].field_2 + 8)
                           ,(size_type)prefix_00);
      if ((in_RDI->field_2)._M_allocated_capacity < (*ppTVar2)->max_count) {
        ppTVar2 = std::vector<Trie_*,_std::allocator<Trie_*>_>::operator[]
                            ((vector<Trie_*,_std::allocator<Trie_*>_> *)
                             ((long)&in_RDI[1].field_2 + 8),(size_type)prefix_00);
        (in_RDI->field_2)._M_allocated_capacity = (*ppTVar2)->max_count;
        ppTVar2 = std::vector<Trie_*,_std::allocator<Trie_*>_>::operator[]
                            ((vector<Trie_*,_std::allocator<Trie_*>_> *)
                             ((long)&in_RDI[1].field_2 + 8),(size_type)prefix_00);
        std::__cxx11::string::operator=
                  ((string *)((in_RDI->field_2)._M_local_buf + 8),(string *)&(*ppTVar2)->max_string)
        ;
      }
    }
    psVar3 = (string *)&prefix_00->field_0x1;
  }
  return;
}

Assistant:

void build_max(string prefix="")
  { max_count = terminus;
    max_string = prefix;
    for (size_t id=0; id<children.size(); id++)
      if (children[id])
      { char c = action2char(id + 1);
        children[id]->build_max(prefix + c);
        if (children[id]->max_count > max_count)
        { max_count  = children[id]->max_count;
          max_string = children[id]->max_string;
        }
      }
  }